

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O1

int lj_opt_loop(jit_State *J)

{
  ushort uVar1;
  IRRef ins;
  MSize nsnapmap;
  undefined8 uVar2;
  lua_State *L;
  int errcode;
  TValue *pTVar3;
  int iVar4;
  LoopState lps;
  jit_State *local_48;
  undefined8 local_40;
  uint local_38;
  
  ins = (J->cur).nins;
  nsnapmap = (J->cur).nsnapmap;
  uVar1 = (J->cur).nsnap;
  local_40 = 0;
  local_38 = 0;
  iVar4 = 0;
  local_48 = J;
  errcode = lj_vm_cpcall(J->L,0,&local_48,cploop_opt);
  J[-1].penalty[0x24].pc.ptr64 = J[-1].penalty[0x24].pc.ptr64 + (ulong)local_38 * -2;
  uVar2._0_2_ = J[-1].penalty[0x23].val;
  uVar2._2_2_ = J[-1].penalty[0x23].reason;
  uVar2._4_4_ = *(undefined4 *)&J[-1].penalty[0x23].field_0xc;
  (*(code *)J[-1].penalty[0x23].pc.ptr64)(uVar2,local_40,(ulong)local_38 * 2,0);
  if (errcode != 0) {
    L = J->L;
    if ((((errcode != 2) || (0x1fff2 < L->top[-1].field_4.it >> 0xf)) ||
        (pTVar3 = L->top + -1, ((int)pTVar3->n | 2U) != 0x1a)) ||
       (iVar4 = J->instunroll, J->instunroll = iVar4 + -1, iVar4 < 1)) {
      lj_err_throw(L,errcode);
    }
    L->top = pTVar3;
    loop_undo(J,ins,(uint)uVar1,nsnapmap);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int lj_opt_loop(jit_State *J)
{
  IRRef nins = J->cur.nins;
  SnapNo nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  LoopState lps;
  int errcode;
  lps.J = J;
  lps.subst = NULL;
  lps.sizesubst = 0;
  errcode = lj_vm_cpcall(J->L, NULL, &lps, cploop_opt);
  lj_mem_freevec(J2G(J), lps.subst, lps.sizesubst, IRRef1);
  if (LJ_UNLIKELY(errcode)) {
    lua_State *L = J->L;
    if (errcode == LUA_ERRRUN && tvisnumber(L->top-1)) {  /* Trace error? */
      int32_t e = numberVint(L->top-1);
      switch ((TraceError)e) {
      case LJ_TRERR_TYPEINS:  /* Type instability. */
      case LJ_TRERR_GFAIL:  /* Guard would always fail. */
	/* Unrolling via recording fixes many cases, e.g. a flipped boolean. */
	if (--J->instunroll < 0)  /* But do not unroll forever. */
	  break;
	L->top--;  /* Remove error object. */
	loop_undo(J, nins, nsnap, nsnapmap);
	return 1;  /* Loop optimization failed, continue recording. */
      default:
	break;
      }
    }
    lj_err_throw(L, errcode);  /* Propagate all other errors. */
  }
  return 0;  /* Loop optimization is ok. */
}